

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::CompareSessionIDs(V2TransportTester *this)

{
  long lVar1;
  bool bVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  Span<const_unsigned_char> vch;
  const_string msg;
  const_string msg_00;
  check_type cVar5;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  assertion_result local_108;
  char **local_f0;
  assertion_result local_e8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  undefined1 local_80 [24];
  char **local_68;
  Info info;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  V2Transport::GetInfo(&info,&this->m_transport);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x52c;
  file.m_begin = (iterator)&local_90;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_a0,msg);
  local_108.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       info.session_id.super__Optional_base<uint256,_true,_true>._M_payload.
       super__Optional_payload_base<uint256>._M_engaged;
  local_108.m_message.px = (element_type *)0x0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68 = (char **)&local_e8;
  local_e8._0_8_ = "info.session_id";
  local_e8.m_message.px = (element_type *)0xbc6410;
  local_80[8] = false;
  local_80._0_8_ = &PTR__lazy_ostream_011481f0;
  local_80._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_a8 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_108,(lazy_ostream *)local_80,1,0,WARN,_cVar5,(size_t)&local_b0,0x52c);
  boost::detail::shared_count::~shared_count(&local_108.m_message.pn);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x52d;
  file_00.m_begin = (iterator)&local_c0;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,msg_00
            );
  vch.m_size = 0x20;
  vch.m_data = (this->m_cipher).m_session_id._M_elems;
  base_blob<256U>::base_blob((base_blob<256U> *)local_80,vch);
  bVar2 = ::operator==((base_blob<256U> *)local_80,(base_blob<256U> *)&info.session_id);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar2;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_f0 = &local_118;
  local_118 = "uint256(MakeUCharSpan(m_cipher.GetSessionID())) == *info.session_id";
  local_110 = "";
  local_108.m_message.px = (element_type *)((ulong)local_108.m_message.px & 0xffffffffffffff00);
  local_108._0_8_ = &PTR__lazy_ostream_011481f0;
  local_108.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_tests.cpp";
  local_120 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&local_108,1,0,WARN,_cVar5,(size_t)&local_128,0x52d);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CompareSessionIDs() const
    {
        auto info = m_transport.GetInfo();
        BOOST_CHECK(info.session_id);
        BOOST_CHECK(uint256(MakeUCharSpan(m_cipher.GetSessionID())) == *info.session_id);
    }